

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_getAtts(ENCODING *enc,char *ptr,int attsMax,ATTRIBUTE *atts)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  char *pcVar5;
  char cVar6;
  int iVar7;
  
  iVar2 = 0;
  cVar6 = '\0';
  iVar7 = 1;
switchD_00585910_caseD_4:
  while( true ) {
    iVar3 = iVar7;
    pcVar5 = ptr;
    ptr = pcVar5 + 2;
    bVar1 = pcVar5[2];
    iVar7 = iVar3;
    if (bVar1 == 0) break;
    if (bVar1 - 0xd8 < 4) {
switchD_00585910_caseD_7:
      if ((iVar3 == 0) && (iVar3 = 1, iVar2 < attsMax)) {
        atts[iVar2].name = ptr;
        atts[iVar2].normalized = '\x01';
      }
      ptr = pcVar5 + 4;
      iVar7 = iVar3;
    }
    else if (3 < bVar1 - 0xdc) {
      if (bVar1 != 0xff) goto switchD_00585910_caseD_5;
      if ((byte)pcVar5[3] < 0xfe && iVar3 == 0) {
LAB_0058591e:
        iVar7 = 1;
        if (iVar2 < attsMax) {
          atts[iVar2].name = ptr;
          atts[iVar2].normalized = '\x01';
          iVar7 = 1;
        }
      }
    }
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar5[3])) {
  case 3:
    if (iVar2 < attsMax) {
      atts[iVar2].normalized = '\0';
    }
  default:
    goto switchD_00585910_caseD_4;
  case 5:
  case 0x16:
  case 0x18:
  case 0x1d:
switchD_00585910_caseD_5:
    if (iVar3 == 0) goto LAB_0058591e;
    goto switchD_00585910_caseD_4;
  case 6:
    if ((iVar3 == 0) && (iVar3 = 1, iVar2 < attsMax)) {
      atts[iVar2].name = ptr;
      atts[iVar2].normalized = '\x01';
    }
    ptr = pcVar5 + 3;
    iVar7 = iVar3;
    goto switchD_00585910_caseD_4;
  case 7:
    goto switchD_00585910_caseD_7;
  case 9:
  case 10:
    iVar7 = 0;
    if (((iVar3 != 1) && (iVar7 = iVar3, iVar3 == 2)) && (iVar7 = 2, iVar2 < attsMax)) {
      atts[iVar2].normalized = '\0';
    }
    goto switchD_00585910_caseD_4;
  case 0xb:
  case 0x11:
    goto switchD_00585910_caseD_b;
  case 0xc:
    if (iVar3 == 2) {
      iVar7 = 2;
      if (cVar6 == '\f') {
        if (iVar2 < attsMax) {
          atts[iVar2].valueEnd = ptr;
        }
        iVar2 = iVar2 + 1;
        cVar6 = '\f';
        iVar7 = 0;
      }
      goto switchD_00585910_caseD_4;
    }
    cVar6 = '\f';
    break;
  case 0xd:
    if (iVar3 == 2) {
      iVar7 = 2;
      if (cVar6 == '\r') {
        if (iVar2 < attsMax) {
          atts[iVar2].valueEnd = ptr;
        }
        iVar2 = iVar2 + 1;
        cVar6 = '\r';
        iVar7 = 0;
      }
      goto switchD_00585910_caseD_4;
    }
    cVar6 = '\r';
    break;
  case 0x15:
    iVar7 = 0;
    if ((((iVar3 != 1) && (iVar7 = iVar3, iVar3 == 2)) && (iVar7 = 2, iVar2 < attsMax)) &&
       (atts[iVar2].normalized != '\0')) {
      if ((ptr != atts[iVar2].valuePtr) && (pcVar5[3] == ' ')) {
        bVar1 = pcVar5[4];
        if (bVar1 < 0xdc) {
          cVar4 = '\a';
          if (3 < bVar1 - 0xd8) {
            if (bVar1 == 0) {
              if ((ulong)(byte)pcVar5[5] == 0x20) goto LAB_00585b91;
              cVar4 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar5[5]);
            }
            else {
LAB_00585b83:
              cVar4 = '\x1d';
            }
          }
        }
        else if (bVar1 - 0xdc < 4) {
          cVar4 = '\b';
        }
        else if ((bVar1 != 0xff) || (cVar4 = '\0', (byte)pcVar5[5] < 0xfe)) goto LAB_00585b83;
        if (cVar4 != cVar6) goto switchD_00585910_caseD_4;
      }
LAB_00585b91:
      atts[iVar2].normalized = '\0';
    }
    goto switchD_00585910_caseD_4;
  }
  iVar7 = 2;
  if (iVar2 < attsMax) {
    atts[iVar2].valuePtr = pcVar5 + 4;
  }
  goto switchD_00585910_caseD_4;
switchD_00585910_caseD_b:
  iVar7 = 2;
  if (iVar3 != 2) {
    return iVar2;
  }
  goto switchD_00585910_caseD_4;
}

Assistant:

static int PTRCALL
PREFIX(getAtts)(const ENCODING *enc, const char *ptr, int attsMax,
                ATTRIBUTE *atts) {
  enum { other, inName, inValue } state = inName;
  int nAtts = 0;
  int open = 0; /* defined when state == inValue;
                   initialization just to shut up compilers */

  for (ptr += MINBPC(enc);; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define START_NAME                                                           \
    if (state == other) {                                                      \
      if (nAtts < attsMax) {                                                   \
        atts[nAtts].name = ptr;                                                \
        atts[nAtts].normalized = 1;                                            \
      }                                                                        \
      state = inName;                                                          \
    }
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n: /* NOTE: The encoding has already been validated. */        \
    START_NAME ptr += (n - MINBPC(enc));                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
    case BT_HEX:
      START_NAME
      break;
#  undef START_NAME
    case BT_QUOT:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_QUOT;
      } else if (open == BT_QUOT) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_APOS:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_APOS;
      } else if (open == BT_APOS) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_AMP:
      if (nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_S:
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax && atts[nAtts].normalized
               && (ptr == atts[nAtts].valuePtr
                   || BYTE_TO_ASCII(enc, ptr) != ASCII_SPACE
                   || BYTE_TO_ASCII(enc, ptr + MINBPC(enc)) == ASCII_SPACE
                   || BYTE_TYPE(enc, ptr + MINBPC(enc)) == open))
        atts[nAtts].normalized = 0;
      break;
    case BT_CR:
    case BT_LF:
      /* This case ensures that the first attribute name is counted
         Apart from that we could just change state on the quote. */
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_GT:
    case BT_SOL:
      if (state != inValue)
        return nAtts;
      break;
    default:
      break;
    }
  }
  /* not reached */
}